

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetLinkerTool
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  char *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmLocalGenerator *this_00;
  _Alloc_hider _Var4;
  int iVar5;
  cmValue cVar6;
  string *psVar7;
  _Alloc_hider _Var8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string linkerType;
  string usingLinker;
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [32];
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  string *local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar11 = this->DeviceLink != false;
  local_58 = "";
  if (bVar11) {
    local_58 = "DEVICE_";
  }
  local_a8._0_8_ = (string *)0x6;
  local_a8._8_8_ = "CMAKE_";
  local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88 = (lang->_M_dataplus)._M_p;
  local_a8._24_8_ = lang->_M_string_length;
  local_80 = 0;
  local_78 = 7;
  local_70 = "_USING_";
  local_60 = (string *)0x0;
  if (bVar11) {
    local_60 = (string *)0x7;
  }
  local_68 = 0;
  local_50 = 0;
  local_48 = 7;
  local_40 = "LINKER_";
  local_38 = 0;
  views._M_len = 5;
  views._M_array = (iterator)local_a8;
  cmCatViews(&local_c8,views);
  pcVar2 = this->Makefile;
  local_a8._0_8_ = local_c8._M_string_length;
  local_a8._8_8_ = local_c8._M_dataplus._M_p;
  local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8._24_8_ = 4;
  local_88 = "MODE";
  local_80 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_a8;
  cmCatViews(&local_108,views_00);
  cVar6 = cmMakefile::GetDefinition(pcVar2,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((cVar6.Value == (string *)0x0) ||
     (value._M_str = "TOOL", value._M_len = 4, local_a8._0_8_ = cVar6,
     iVar5 = cmValue::Compare((cmValue *)local_a8,value), iVar5 != 0)) {
    pcVar2 = this->Makefile;
    local_a8._0_8_ = (string *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_LINKER","");
    psVar7 = (string *)cmMakefile::GetDefinition(pcVar2,(string *)local_a8);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar7->_M_string_length);
    local_108.field_2._M_allocated_capacity = local_a8._16_8_;
    local_108._M_dataplus._M_p = (pointer)local_a8._0_8_;
    if ((string *)local_a8._0_8_ == (string *)(local_a8 + 0x10)) goto LAB_004bc74b;
  }
  else {
    GetLinkerTypeProperty(&local_108,this,lang,config);
    if (local_108._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x833fed);
    }
    local_a8._0_8_ = local_c8._M_string_length;
    local_a8._8_8_ = local_c8._M_dataplus._M_p;
    local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8._24_8_ = local_108._M_string_length;
    local_88 = local_108._M_dataplus._M_p;
    local_80 = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_a8;
    cmCatViews(&local_e8,views_01);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)cmMakefile::GetDefinition(this->Makefile,&local_c8);
    if (psVar7 == (string *)0x0) {
      iVar5 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
      if ((((char)iVar5 == '\0') || (local_108._M_string_length != 7)) ||
         (iVar5 = bcmp(local_108._M_dataplus._M_p,"DEFAULT",7), iVar5 != 0)) {
        pcVar2 = this->Makefile;
        local_a8._0_8_ = (string *)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_LINKER","");
        psVar7 = (string *)cmMakefile::GetDefinition(pcVar2,(string *)local_a8);
        if ((string *)local_a8._0_8_ != (string *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        _Var4._M_p = local_108._M_dataplus._M_p;
        if ((local_108._M_string_length == 7) &&
           (iVar5 = bcmp(local_108._M_dataplus._M_p,"DEFAULT",7), iVar5 == 0)) goto LAB_004bc70e;
        pcVar1 = _Var4._M_p + local_108._M_string_length;
        _Var8._M_p = _Var4._M_p;
        if (0 < (long)local_108._M_string_length >> 2) {
          _Var8._M_p = _Var4._M_p + (local_108._M_string_length & 0xfffffffffffffffc);
          lVar10 = ((long)local_108._M_string_length >> 2) + 1;
          pcVar9 = _Var4._M_p + 3;
          do {
            iVar5 = isupper((int)pcVar9[-3]);
            if (iVar5 == 0) {
              pcVar9 = pcVar9 + -3;
              goto LAB_004bc5e7;
            }
            iVar5 = isupper((int)pcVar9[-2]);
            if (iVar5 == 0) {
              pcVar9 = pcVar9 + -2;
              goto LAB_004bc5e7;
            }
            iVar5 = isupper((int)pcVar9[-1]);
            if (iVar5 == 0) {
              pcVar9 = pcVar9 + -1;
              goto LAB_004bc5e7;
            }
            iVar5 = isupper((int)*pcVar9);
            if (iVar5 == 0) goto LAB_004bc5e7;
            lVar10 = lVar10 + -1;
            pcVar9 = pcVar9 + 4;
          } while (1 < lVar10);
        }
        lVar10 = (long)pcVar1 - (long)_Var8._M_p;
        if (lVar10 == 1) {
LAB_004bc5cc:
          iVar5 = isupper((int)*_Var8._M_p);
          pcVar9 = _Var8._M_p;
          if (iVar5 != 0) {
            pcVar9 = pcVar1;
          }
        }
        else if (lVar10 == 2) {
LAB_004bc571:
          iVar5 = isupper((int)*_Var8._M_p);
          pcVar9 = _Var8._M_p;
          if (iVar5 != 0) {
            _Var8._M_p = _Var8._M_p + 1;
            goto LAB_004bc5cc;
          }
        }
        else {
          pcVar9 = pcVar1;
          if ((lVar10 == 3) && (iVar5 = isupper((int)*_Var8._M_p), pcVar9 = _Var8._M_p, iVar5 != 0))
          {
            _Var8._M_p = _Var8._M_p + 1;
            goto LAB_004bc571;
          }
        }
LAB_004bc5e7:
        this_00 = this->LocalGenerator;
        local_a8._24_8_ = local_108._M_string_length;
        if (pcVar9 == pcVar1) {
          local_a8._0_8_ = (string *)0xd;
          local_a8._8_8_ = "LINKER_TYPE \'";
          local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_88 = _Var4._M_p;
          local_80 = 0;
          local_78 = 0x30;
          local_70 = "\' is unknown or not supported by this toolchain.";
          local_68 = 0;
          views_03._M_len = 3;
          views_03._M_array = (iterator)local_a8;
          cmCatViews(&local_e8,views_03);
          cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_e8);
        }
        else {
          local_a8._0_8_ = (string *)0xd;
          local_a8._8_8_ = "LINKER_TYPE \'";
          local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_88 = _Var4._M_p;
          local_80 = 0;
          local_78 = 0x2c;
          local_70 = "\' is unknown. Did you forget to define the \'";
          local_68 = 0;
          local_60 = (string *)local_c8._M_string_length;
          local_58 = local_c8._M_dataplus._M_p;
          local_50 = 0;
          local_48 = 0xb;
          local_40 = "\' variable?";
          local_38 = 0;
          views_02._M_len = 5;
          views_02._M_array = (iterator)local_a8;
          cmCatViews(&local_e8,views_02);
          cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_004bc70e;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
LAB_004bc70e:
      if (psVar7 == (string *)0x0) {
        psVar7 = &cmValue::Empty_abi_cxx11_;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar7->_M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_004bc74b;
  }
  operator_delete(local_108._M_dataplus._M_p,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108.field_2._M_allocated_capacity)->_M_dataplus)._M_p +
                         1));
LAB_004bc74b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTool(const std::string& lang,
                                             const std::string& config) const
{
  auto usingLinker =
    cmStrCat("CMAKE_", lang, "_USING_", this->IsDeviceLink() ? "DEVICE_" : "",
             "LINKER_");
  auto format = this->Makefile->GetDefinition(cmStrCat(usingLinker, "MODE"));
  if (!format || format != "TOOL"_s) {
    return this->Makefile->GetDefinition("CMAKE_LINKER");
  }

  auto linkerType = this->GetLinkerTypeProperty(lang, config);
  if (linkerType.empty()) {
    linkerType = "DEFAULT";
  }
  usingLinker = cmStrCat(usingLinker, linkerType);
  auto linkerTool = this->Makefile->GetDefinition(usingLinker);

  if (!linkerTool) {
    if (this->GetGlobalGenerator()->IsVisualStudio() &&
        linkerType == "DEFAULT"_s) {
      return std::string{};
    }

    // fall-back to generic definition
    linkerTool = this->Makefile->GetDefinition("CMAKE_LINKER");

    if (linkerType != "DEFAULT"_s) {
      auto isCMakeLinkerType = [](const std::string& type) -> bool {
        return std::all_of(type.cbegin(), type.cend(),
                           [](char c) { return std::isupper(c); });
      };
      if (isCMakeLinkerType(linkerType)) {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown or not supported by this toolchain."));
      } else {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown. Did you forget to define the '", usingLinker,
                   "' variable?"));
      }
    }
  }

  return linkerTool;
}